

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

bool Cipher::generateClustersInitialGuess
               (TParameters *params,TSimilarityMap *ccMap,TClusters *clusters)

{
  double *pdVar1;
  undefined8 uVar2;
  double dVar3;
  pointer piVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  mapped_type *pmVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  undefined8 *puVar13;
  int *cid;
  ulong uVar14;
  undefined8 *puVar15;
  pointer piVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  undefined8 *puVar22;
  TClusters *__range2;
  ulong uVar23;
  TSimilarityMap *pTVar24;
  int iVar25;
  size_type __new_size;
  ulong uVar26;
  undefined8 *puVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> used;
  undefined8 *local_e8;
  undefined8 *local_e0;
  allocator_type local_d2;
  bool local_d1;
  size_type local_d0;
  ulong local_c8;
  TClusters *local_c0;
  TParameters *local_b8;
  ulong local_b0;
  TSimilarityMap *local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  uVar14 = ((long)(ccMap->
                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(ccMap->
                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar20 = (uint)uVar14;
  __new_size = (size_type)(int)uVar20;
  local_b8 = params;
  local_a8 = ccMap;
  std::vector<int,_std::allocator<int>_>::resize(clusters,__new_size);
  auVar6 = _DAT_001230a0;
  local_b0 = uVar14;
  if (0 < (int)uVar20) {
    piVar16 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (ulong)(uVar20 & 0x7fffffff) - 1;
    auVar29._8_4_ = (int)lVar12;
    auVar29._0_8_ = lVar12;
    auVar29._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar14 = 0;
    auVar29 = auVar29 ^ _DAT_001230a0;
    auVar30 = _DAT_00123090;
    do {
      auVar31 = auVar30 ^ auVar6;
      if ((bool)(~(auVar31._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar31._0_4_ ||
                  auVar29._4_4_ < auVar31._4_4_) & 1)) {
        piVar16[uVar14] = (int)uVar14;
      }
      if ((auVar31._12_4_ != auVar29._12_4_ || auVar31._8_4_ <= auVar29._8_4_) &&
          auVar31._12_4_ <= auVar29._12_4_) {
        piVar16[uVar14 + 1] = (int)uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar12 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 2;
      auVar30._8_8_ = lVar12 + 2;
    } while ((uVar20 + 1 & 0xfffffffe) != uVar14);
    if (uVar20 != 1) {
      local_98 = (ulong)(uVar20 - 1);
      local_70 = (ulong)(uVar20 & 0x7fffffff);
      uVar26 = 1;
      lVar12 = 0x10;
      local_80 = 0x7ffffffffffffff0;
      local_e8 = (undefined8 *)0x0;
      puVar15 = (undefined8 *)0x0;
      local_e0 = (undefined8 *)0x0;
      uVar14 = 0;
      pTVar24 = local_a8;
      local_d0 = __new_size;
      local_c0 = clusters;
      do {
        uVar19 = uVar14 + 1;
        local_68 = uVar14 * 3;
        puVar27 = local_e8;
        local_c8 = uVar19;
        local_a0 = uVar14;
        local_90 = lVar12;
        local_88 = uVar26;
        do {
          uVar2 = *(undefined8 *)
                   (*(long *)((long)&(((pTVar24->
                                       super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                                     super__Vector_impl_data + local_68 * 8) + lVar12);
          if (puVar15 == local_e0) {
            uVar14 = (long)puVar15 - (long)puVar27;
            if (uVar14 == local_80) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar23 = (long)uVar14 >> 4;
            uVar21 = 1;
            if (puVar15 != puVar27) {
              uVar21 = uVar23;
            }
            uVar10 = uVar21 + uVar23;
            if (0x7fffffffffffffe < uVar10) {
              uVar10 = 0x7ffffffffffffff;
            }
            uVar18 = 0x7ffffffffffffff;
            if (!CARRY8(uVar21,uVar23)) {
              uVar18 = uVar10;
            }
            if (uVar18 == 0) {
              local_e8 = (undefined8 *)0x0;
            }
            else {
              local_78 = uVar2;
              local_e8 = (undefined8 *)operator_new(uVar18 << 4);
              uVar19 = local_c8;
              uVar2 = local_78;
            }
            *(int *)(local_e8 + uVar23 * 2) = (int)local_a0;
            *(int *)((long)local_e8 + uVar23 * 0x10 + 4) = (int)uVar26;
            local_e8[uVar23 * 2 + 1] = uVar2;
            if (0 < (long)uVar14) {
              memmove(local_e8,puVar27,uVar14);
              uVar19 = local_c8;
            }
            pTVar24 = local_a8;
            if (puVar27 != (undefined8 *)0x0) {
              operator_delete(puVar27,uVar14);
              uVar19 = local_c8;
            }
            puVar22 = (undefined8 *)(uVar14 + (long)local_e8);
            local_e0 = local_e8 + uVar18 * 2;
          }
          else {
            *(int *)puVar15 = (int)local_a0;
            *(int *)((long)puVar15 + 4) = (int)uVar26;
            puVar15[1] = uVar2;
            puVar22 = puVar15;
            local_e8 = puVar27;
          }
          puVar15 = puVar22 + 2;
          uVar26 = uVar26 + 1;
          lVar12 = lVar12 + 0x10;
          puVar27 = local_e8;
        } while (local_70 != uVar26);
        uVar26 = local_88 + 1;
        lVar12 = local_90 + 0x10;
        uVar14 = uVar19;
      } while (uVar19 != local_98);
      clusters = local_c0;
      __new_size = local_d0;
      if (local_e8 != puVar15) {
        uVar14 = (long)puVar15 - (long)local_e8 >> 4;
        lVar12 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_e8,puVar15,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
        clusters = local_c0;
        if ((long)puVar15 - (long)local_e8 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_e8,puVar15);
          __new_size = local_d0;
        }
        else {
          puVar27 = local_e8 + 0x20;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair*,std::vector<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair,std::allocator<Cipher::generateClustersInitialGuess(Cipher::TParameters_const&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,std::vector<int,std::allocator<int>>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_e8,puVar27);
          __new_size = local_d0;
          if (puVar27 != puVar15) {
            do {
              uVar2 = *puVar27;
              dVar3 = (double)puVar27[1];
              puVar11 = puVar27;
              puVar13 = puVar27;
              if ((double)puVar27[-1] <= dVar3 && dVar3 != (double)puVar27[-1]) {
                do {
                  puVar11 = puVar13 + -2;
                  *puVar13 = puVar13[-2];
                  puVar13[1] = puVar13[-1];
                  pdVar1 = (double *)(puVar13 + -3);
                  puVar13 = puVar11;
                } while (*pdVar1 <= dVar3 && dVar3 != *pdVar1);
              }
              *puVar11 = uVar2;
              puVar11[1] = dVar3;
              bVar28 = puVar27 != puVar22;
              puVar27 = puVar27 + 2;
            } while (bVar28);
          }
        }
      }
      goto LAB_00115378;
    }
  }
  local_e8 = (undefined8 *)0x0;
  puVar15 = (undefined8 *)0x0;
  local_e0 = (undefined8 *)0x0;
LAB_00115378:
  local_d1 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_60,__new_size,&local_d1,&local_d2);
  uVar14 = (ulong)((long)puVar15 - (long)local_e8) >> 4;
  if (0 < (int)uVar14) {
    piVar16 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = 0;
    uVar26 = local_b0;
    do {
      iVar25 = piVar16[*(int *)(local_e8 + uVar19 * 2)];
      iVar9 = piVar16[*(int *)((long)local_e8 + uVar19 * 0x10 + 4)];
      if (iVar25 != iVar9) {
        iVar17 = iVar25 + 0x3f;
        if (-1 < iVar25) {
          iVar17 = iVar25;
        }
        if ((*(ulong *)(local_60._M_impl._0_8_ +
                       ((long)(iVar17 >> 6) +
                       ((ulong)(((long)iVar25 & 0x800000000000003fU) < 0x8000000000000001) - 1)) * 8
                       ) >> ((long)iVar25 & 0x3fU) & 1) == 0) {
          iVar17 = iVar9 + 0x3f;
          if (-1 < iVar9) {
            iVar17 = iVar9;
          }
          if ((*(ulong *)(local_60._M_impl._0_8_ +
                         ((long)(iVar17 >> 6) +
                         ((ulong)(((long)iVar9 & 0x800000000000003fU) < 0x8000000000000001) - 1)) *
                         8) >> ((long)iVar9 & 0x3fU) & 1) == 0) {
            iVar17 = iVar9;
            if (iVar9 < iVar25) {
              iVar17 = iVar25;
            }
            if (iVar25 < iVar9) {
              iVar9 = iVar25;
            }
            if (0 < (int)local_b0) {
              uVar21 = 0;
              do {
                if (piVar16[uVar21] == iVar17) {
                  piVar16[uVar21] = iVar9;
                }
                uVar21 = uVar21 + 1;
              } while ((local_b0 & 0x7fffffff) != uVar21);
            }
            iVar25 = iVar17 + 0x3f;
            if (-1 < iVar17) {
              iVar25 = iVar17;
            }
            *(ulong *)(local_60._M_impl._0_8_ +
                      ((long)(iVar25 >> 6) +
                      ((ulong)(((long)iVar17 & 0x800000000000003fU) < 0x8000000000000001) - 1)) * 8)
                 = *(ulong *)(local_60._M_impl._0_8_ +
                             ((long)(iVar25 >> 6) +
                             ((ulong)(((long)iVar17 & 0x800000000000003fU) < 0x8000000000000001) - 1
                             )) * 8) | 1L << ((byte)iVar17 & 0x3f);
            uVar20 = (int)uVar26 - 1;
            uVar26 = (ulong)uVar20;
            if ((int)uVar20 <= local_b8->maxClusters) goto LAB_001154d9;
          }
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar14 & 0x7fffffff));
  }
  if ((_Bit_type *)local_60._M_impl._0_8_ != (_Bit_type *)0x0) {
LAB_001154d9:
    operator_delete((void *)local_60._M_impl._0_8_,
                    (long)local_60._M_impl.super__Rb_tree_header._M_header._M_right -
                    local_60._M_impl._0_8_);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_60 + 8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar25 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar16 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (piVar16 != piVar4) {
    do {
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,piVar16);
      if (*pmVar7 < 1) {
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,piVar16);
        iVar25 = iVar25 + 1;
        *pmVar7 = iVar25;
      }
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar4);
    piVar16 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar16 != piVar4) {
      do {
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,piVar16);
        *piVar16 = *pmVar7 + -1;
        piVar16 = piVar16 + 1;
      } while (piVar16 != piVar4);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  piVar8 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar5 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar8 != piVar5) {
    do {
      if ((*piVar8 < 0) || (local_b8->maxClusters <= *piVar8)) {
        __assert_fail("cid >= 0 && cid < params.maxClusters",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                      ,0x3a4,
                      "bool Cipher::generateClustersInitialGuess(const TParameters &, const TSimilarityMap &, TClusters &)"
                     );
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar5);
  }
  if (local_e8 != (undefined8 *)0x0) {
    operator_delete(local_e8,(long)local_e0 - (long)local_e8);
  }
  return true;
}

Assistant:

bool generateClustersInitialGuess(
            const TParameters & params,
            const TSimilarityMap & ccMap,
            TClusters & clusters) {
        int n = ccMap.size();

        int nClusters = n;
        clusters.resize(n);
        for (int i = 0; i < n; ++i) {
            clusters[i] = i;
        }

        struct Pair {
            int i;
            int j;
            double cc;

            bool operator < (const Pair & a) const { return cc > a.cc; }
        };

        std::vector<Pair> ccPairs;
        for (int i = 0; i < n - 1; ++i) {
            for (int j = i + 1; j < n; ++j) {
                ccPairs.emplace_back(Pair{i, j, ccMap[i][j].cc});
            }
        }

        std::sort(ccPairs.begin(), ccPairs.end());

        {
            std::vector<bool> used(n);

            for (int k = 0; k < (int) ccPairs.size(); ++k) {
                int i = ccPairs[k].i;
                int j = ccPairs[k].j;

                if (clusters[i] == clusters[j]) continue;

                int cidi = clusters[i];
                int cidj = clusters[j];

                if (used[cidi] || used[cidj]) continue;

                if (cidi > cidj) {
                    std::swap(cidi, cidj);
                }

                for (int p = 0; p < n; ++p) {
                    if (clusters[p] == cidj) {
                        clusters[p] = cidi;
                    }
                }
                used[cidj] = true;
                --nClusters;

                if (nClusters <= params.maxClusters) break;
            }
        }

        {
            int cnt = 0;
            std::map<int, int> used;
            for (auto & cid : clusters) {
                if (used[cid] > 0) continue;
                used[cid] = ++cnt;
            }

            for (auto & cid : clusters) {
                cid = used[cid] - 1;
            }
        }

        //printf("nClusters = %d\n", nClusters);
        for (auto & cid : clusters) {
            assert(cid >= 0 && cid < params.maxClusters);
        }

        return true;
    }